

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Variability v)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 == 2) {
    pcVar3 = "config";
    pcVar1 = "";
  }
  else if (iVar2 == 1) {
    pcVar3 = "uniform";
    pcVar1 = "";
  }
  else if (iVar2 == 0) {
    pcVar3 = "varying";
    pcVar1 = "";
  }
  else {
    pcVar3 = "\"[[VariabilityInvalid]]\"";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::Variability v) {
  if (v == tinyusdz::Variability::Varying) {
    return "varying";
  } else if (v == tinyusdz::Variability::Uniform) {
    return "uniform";
  } else if (v == tinyusdz::Variability::Config) {
    return "config";
  } else {
    return "\"[[VariabilityInvalid]]\"";
  }
}